

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_prot.c
# Opt level: O2

_Bool xdr_rpcb(XDR *xdrs,RPCB *objp)

{
  bool_t bVar1;
  u_int __maxsize;
  u_int __maxsize_00;
  u_int __maxsize_01;
  
  bVar1 = xdr_uint32_t((XDR *)xdrs,&objp->r_prog);
  if ((char)bVar1 != '\0') {
    bVar1 = xdr_uint32_t((XDR *)xdrs,&objp->r_vers);
    if ((char)bVar1 != '\0') {
      bVar1 = xdr_string((XDR *)xdrs,&objp->r_netid,__maxsize);
      if ((char)bVar1 != '\0') {
        bVar1 = xdr_string((XDR *)xdrs,&objp->r_addr,__maxsize_00);
        if ((char)bVar1 != '\0') {
          bVar1 = xdr_string((XDR *)xdrs,&objp->r_owner,__maxsize_01);
          return SUB41(bVar1,0);
        }
      }
    }
  }
  return false;
}

Assistant:

bool
xdr_rpcb(XDR *xdrs, RPCB *objp)
{
	if (!xdr_u_int32_t(xdrs, &objp->r_prog))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->r_vers))
		return (false);
	if (!xdr_string(xdrs, &objp->r_netid, (u_int) ~ 0))
		return (false);
	if (!xdr_string(xdrs, &objp->r_addr, (u_int) ~ 0))
		return (false);
	if (!xdr_string(xdrs, &objp->r_owner, (u_int) ~ 0))
		return (false);
	return (true);
}